

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O1

_Bool borg_read_unknown(void)

{
  _Bool _Var1;
  char *what;
  uint8_t *puVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  if ((ulong)z_info->pack_size == 0) {
    uVar4 = 0xffffffff;
  }
  else {
    puVar2 = &borg_items->iqty;
    uVar5 = 0xffffffff;
    uVar3 = 0;
    do {
      if (((*puVar2 != '\0') && (puVar2[-4] == '\x19')) && (*(uint32_t *)(puVar2 + -0xc) == 0)) {
        uVar5 = uVar3 & 0xffffffff;
      }
      uVar4 = (uint)uVar5;
      uVar3 = uVar3 + 1;
      puVar2 = puVar2 + 0x388;
    } while (z_info->pack_size != uVar3);
  }
  if ((((int)uVar4 < 0) || (_Var1 = no_light(player), _Var1)) ||
     ((borg_skill[0x65] != 0 || (borg_skill[0x67] != 0)))) {
    _Var1 = false;
  }
  else {
    what = format("# Reading unknown scroll %s.",borg_items + uVar4);
    borg_note(what);
    borg_keypress(0x72);
    borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar4]);
    borg_keypress(0xe000);
    goal_item = -1;
    goal_ware = -1;
    goal_shop = -1;
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

bool borg_read_unknown(void)
{
    int i, n = -1;

    /* Scan the pack */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item* item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Require correct tval */
        if (item->tval != TV_SCROLL)
            continue;

        /* Skip aware items */
        if (item->kind)
            continue;

        /* Save this item */
        n = i;
    }

    /* None available */
    if (n < 0)
        return (false);

    /* Dark */
    if (no_light(player))
        return (false);

    /* Blind or Confused */
    if (borg_skill[BI_ISBLIND] || borg_skill[BI_ISCONFUSED])
        return (false);

    /* Log the message */
    borg_note(format("# Reading unknown scroll %s.", borg_items[n].desc));

    /* Perform the action */
    borg_keypress('r');
    borg_keypress(all_letters_nohjkl[n]);

    /* Incase it is ID scroll, ESCAPE out. */
    borg_keypress(ESCAPE);

    /* Hack -- Clear "shop" goals */
    goal_shop = goal_ware = goal_item = -1;

    /* Success */
    return (true);
}